

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseResolveOrRejectFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseResolveOrRejectFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptPromise *promise,
          bool isReject,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord)

{
  DynamicType *type;
  Recycler *recycler;
  JavascriptPromiseResolveOrRejectFunction *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptPromiseResolveOrRejectFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19e2;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
  this_00 = (JavascriptPromiseResolveOrRejectFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x58,recycler,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
  ;
  JavascriptPromiseResolveOrRejectFunction::JavascriptPromiseResolveOrRejectFunction
            (this_00,type,(FunctionInfo *)JavascriptPromise::EntryInfo::ResolveOrRejectFunction,
             promise,isReject,alreadyResolvedRecord);
  (*(this_00->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(this_00,0xd1,&DAT_1000000000001,2,0,0,0xf);
  return this_00;
}

Assistant:

JavascriptPromiseResolveOrRejectFunction* JavascriptLibrary::CreatePromiseResolveOrRejectFunction(JavascriptMethod entryPoint, JavascriptPromise* promise, bool isReject, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::ResolveOrRejectFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseResolveOrRejectFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseResolveOrRejectFunction, type, functionInfo, promise, isReject, alreadyResolvedRecord);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }